

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void SQCompilation::StaticAnalyzer::mergeKnownBindings(HSQOBJECT *bindings)

{
  SQTable *this;
  SQObjectValue SVar1;
  SQObjectPtr key;
  SQObjectPtr pos;
  SQObjectPtr val;
  SQObject local_88;
  long *local_78 [2];
  long local_68 [2];
  SQObjectPtr local_58;
  SQObject local_48;
  
  if ((bindings != (HSQOBJECT *)0x0) && (bindings->_type == OT_TABLE)) {
    this = (bindings->_unVal).pTable;
    local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_58.super_SQObject._type = OT_INTEGER;
    local_58.super_SQObject._flags = '\0';
    local_88._unVal.pTable = (SQTable *)0x0;
    local_88._type = OT_NULL;
    local_88._flags = '\0';
    local_88._5_3_ = 0;
    local_48._unVal.pTable = (SQTable *)0x0;
    local_48._type = OT_NULL;
    local_48._flags = '\0';
    local_48._5_3_ = 0;
    SVar1.pTable = local_58.super_SQObject._unVal.pTable;
    while (local_58.super_SQObject._unVal = SVar1,
          SVar1.nInteger =
               SQTable::Next(this,false,&local_58,(SQObjectPtr *)&local_88,(SQObjectPtr *)&local_48)
          , -1 < SVar1.nInteger) {
      if (local_88._type == OT_STRING) {
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,&(local_88._unVal.pTable)->_firstfree,
                   (long)&(((local_88._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                          _sharedstate)->_alloc_ctx + (long)&(local_88._unVal.pTable)->_firstfree);
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::_M_emplace<std::__cxx11::string>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)knownBindings_abi_cxx11_);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
      }
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_88);
    SQObjectPtr::~SQObjectPtr(&local_58);
  }
  return;
}

Assistant:

void StaticAnalyzer::mergeKnownBindings(const HSQOBJECT *bindings) {
  if (bindings && sq_istable(*bindings)) {
    SQTable *table = _table(*bindings);

    SQInteger idx = 0;
    SQObjectPtr pos(idx), key, val;

    while ((idx = table->Next(false, pos, key, val)) >= 0) {
      if (sq_isstring(key)) {
        SQInteger len = _string(key)->_len;
        const SQChar *s = _string(key)->_val;
        knownBindings.emplace(std::string(s, s+len));
      }
      pos._unVal.nInteger = idx;
    }
  }
}